

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O2

string * __thiscall helics::InputInfo::getInjectionType_abi_cxx11_(InputInfo *this)

{
  string *this_00;
  pointer psVar1;
  __type_conflict _Var2;
  pointer psVar3;
  string local_50;
  
  this_00 = &this->inputType;
  if ((this->inputType)._M_string_length == 0) {
    psVar3 = (this->source_info).
             super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->source_info).
             super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar3 != psVar1) {
      do {
        if (psVar3 == psVar1) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &((this->source_info).
                      super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                      ._M_impl.super__Vector_impl_data._M_start)->type);
          return this_00;
        }
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&psVar3->type,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&((this->source_info).
                                   super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->type);
        psVar3 = psVar3 + 1;
      } while (_Var2);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,'[');
      psVar1 = (this->source_info).
               super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar3 = (this->source_info).
                    super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1
          ) {
        generateJsonQuotedString(&local_50,(string *)&psVar3->type);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   &local_50);
        std::__cxx11::string::~string((string *)&local_50);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,',');
      }
      (this->inputType)._M_dataplus._M_p[(this->inputType)._M_string_length - 1] = ']';
    }
  }
  return this_00;
}

Assistant:

const std::string& InputInfo::getInjectionType() const
{
    if (inputType.empty()) {
        if (!source_info.empty()) {
            bool allTheSame{true};
            for (const auto& src : source_info) {
                if (src.type != source_info.front().type) {
                    allTheSame = false;
                    break;
                }
            }
            if (allTheSame) {
                inputType = source_info.front().type;
            } else {
                inputType.push_back('[');
                for (const auto& src : source_info) {
                    inputType.append(generateJsonQuotedString(src.type));
                    inputType.push_back(',');
                }
                inputType.back() = ']';
            }
        }
    }
    return inputType;
}